

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O3

void set_want_move_all_wins(Am_Object *root_window,bool want_move)

{
  Am_Object *this;
  bool bVar1;
  Am_Value *this_00;
  Am_Object win;
  Am_Instance_Iterator instance_iter;
  Am_Object local_60;
  Am_Instance_Iterator local_58;
  Am_Instance_Iterator local_48;
  Am_Object local_38;
  
  Am_Object::Am_Object(&local_38,root_window);
  Am_Instance_Iterator::Am_Instance_Iterator(&local_58,&local_38);
  Am_Object::~Am_Object(&local_38);
  local_60.data = (Am_Object_Data *)0x0;
  Am_Instance_Iterator::Start(&local_58);
  this = &local_48.prototype;
  while( true ) {
    bVar1 = Am_Instance_Iterator::Last(&local_58);
    if (bVar1) break;
    Am_Instance_Iterator::Get(&local_48);
    Am_Object::operator=(&local_60,&local_48.current);
    Am_Object::~Am_Object(&local_48.current);
    this_00 = Am_Object::Get(&local_60,0x69,0);
    bVar1 = Am_Value::operator_cast_to_bool(this_00);
    if (bVar1) {
      Am_Object::Get_Object(&local_48.current,(Am_Slot_Key)&local_60,10);
      bVar1 = Am_Object::Valid(&local_48.current);
      Am_Object::~Am_Object(&local_48.current);
      if (bVar1) {
        Am_Object::Am_Object(this,&local_60);
        set_want_move_one_win(this,want_move);
        Am_Object::~Am_Object(this);
      }
    }
    set_want_move_all_wins(&local_60,want_move);
    Am_Instance_Iterator::Next(&local_58);
  }
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_58.prototype);
  Am_Object::~Am_Object(&local_58.current);
  return;
}

Assistant:

static void
set_want_move_all_wins(const Am_Object &root_window, bool want_move)
{
  Am_Instance_Iterator instance_iter(root_window);
  Am_Object win;
  for (instance_iter.Start(); !instance_iter.Last(); instance_iter.Next()) {
    win = instance_iter.Get();
    if ((bool)win.Get(Am_VISIBLE) && win.Get_Owner().Valid())
      //just visible windows
      set_want_move_one_win(win, want_move);
    //recurse on instance
    set_want_move_all_wins(win, want_move);
  }
}